

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-read-array.h
# Opt level: O1

int read_array(coda_cursor *cursor,void *dst)

{
  ushort *puVar1;
  undefined1 uVar2;
  coda_type_class cVar3;
  coda_dynamic_type_struct *pcVar4;
  long byte_offset;
  int iVar5;
  coda_dynamic_type_struct *pcVar6;
  long lVar7;
  void *dst_00;
  size_t __n;
  
  pcVar4 = cursor->stack[(long)cursor->n + -1].type;
  if (pcVar4[1].backend != 2) {
    __assert_fail("variable->tag == tag_cdf_variable",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-cursor.c"
                  ,0xd7,"int read_array(const coda_cursor *, void *)");
  }
  pcVar6 = *(coda_dynamic_type_struct **)(pcVar4 + 2);
  if (*(coda_dynamic_type_struct **)(pcVar4 + 2) == (coda_dynamic_type_struct *)0x0) {
    pcVar6 = pcVar4;
  }
  cVar3 = pcVar6->definition->type_class;
  if (0 < *(int *)&pcVar4[2].definition) {
    __n = (size_t)(int)(pcVar4[3].backend * *(int *)((long)&pcVar4[2].definition + 4));
    lVar7 = 0;
    dst_00 = dst;
    do {
      byte_offset = *(long *)(*(long *)(pcVar4 + 4) + lVar7 * 8);
      if (byte_offset < 0) {
        coda_set_error(-200,"Missing record not supported for CDF variable");
        return -1;
      }
      if (pcVar4[4].definition == (coda_type *)0x0) {
        iVar5 = read_bytes((coda_product *)cursor->product[1].filename,byte_offset,__n,dst_00);
        if (iVar5 != 0) {
          return -1;
        }
      }
      else {
        memcpy(dst_00,(void *)((long)&(pcVar4[4].definition)->format + byte_offset),__n);
      }
      lVar7 = lVar7 + 1;
      dst_00 = (void *)((long)dst_00 + __n);
    } while (lVar7 < *(int *)&pcVar4[2].definition);
  }
  if ((cVar3 != coda_text_class) && (*(int *)&cursor->product[1].field_0x14 != 1)) {
    switch(pcVar4[3].backend) {
    case coda_backend_binary:
      break;
    case 2:
      if (0 < *(int *)((long)&pcVar4[2].definition + 4) * *(int *)&pcVar4[2].definition) {
        lVar7 = 0;
        do {
          puVar1 = (ushort *)((long)dst + lVar7 * 2);
          *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
          lVar7 = lVar7 + 1;
        } while (lVar7 < (long)*(int *)((long)&pcVar4[2].definition + 4) *
                         (long)*(int *)&pcVar4[2].definition);
      }
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-cursor.c"
                    ,0x116,"int read_array(const coda_cursor *, void *)");
    case 4:
      if (0 < *(int *)((long)&pcVar4[2].definition + 4) * *(int *)&pcVar4[2].definition) {
        lVar7 = 0;
        do {
          uVar2 = *(undefined1 *)((long)dst + lVar7 * 4 + 3);
          *(undefined1 *)((long)dst + lVar7 * 4 + 3) = *(undefined1 *)((long)dst + lVar7 * 4);
          *(undefined1 *)((long)dst + lVar7 * 4) = uVar2;
          puVar1 = (ushort *)((long)dst + lVar7 * 4 + 1);
          *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
          lVar7 = lVar7 + 1;
        } while (lVar7 < (long)*(int *)((long)&pcVar4[2].definition + 4) *
                         (long)*(int *)&pcVar4[2].definition);
      }
      break;
    case 8:
      if (0 < *(int *)((long)&pcVar4[2].definition + 4) * *(int *)&pcVar4[2].definition) {
        lVar7 = 0;
        do {
          swap8(dst);
          lVar7 = lVar7 + 1;
          dst = (void *)((long)dst + 8);
        } while (lVar7 < (long)*(int *)((long)&pcVar4[2].definition + 4) *
                         (long)*(int *)&pcVar4[2].definition);
      }
    }
  }
  return 0;
}

Assistant:

static int read_array(const coda_cursor *cursor, read_function read_basic_type_function, uint8_t *dst,
                      int basic_type_size, coda_array_ordering array_ordering)
{
    coda_cursor array_cursor;
    long dim[CODA_MAX_NUM_DIMS];
    int num_dims;
    long num_elements;
    int i;

    if (coda_cursor_get_array_dim(cursor, &num_dims, dim) != 0)
    {
        return -1;
    }

    array_cursor = *cursor;
    if (num_dims <= 1 || array_ordering != coda_array_ordering_fortran)
    {
        /* C-style array ordering */

        num_elements = 1;
        for (i = 0; i < num_dims; i++)
        {
            num_elements *= dim[i];
        }

        if (num_elements > 0)
        {
            if (coda_cursor_goto_array_element_by_index(&array_cursor, 0) != 0)
            {
                return -1;
            }
            for (i = 0; i < num_elements; i++)
            {
                if ((*read_basic_type_function)(&array_cursor, &dst[i * basic_type_size]) != 0)
                {
                    return -1;
                }
                if (i < num_elements - 1)
                {
                    if (coda_cursor_goto_next_array_element(&array_cursor) != 0)
                    {
                        return -1;
                    }
                }
            }
        }
    }
    else
    {
        long incr[CODA_MAX_NUM_DIMS + 1];
        long increment;
        long c_index;
        long fortran_index;

        /* Fortran-style array ordering */

        incr[0] = 1;
        for (i = 0; i < num_dims; i++)
        {
            incr[i + 1] = incr[i] * dim[i];
        }

        increment = incr[num_dims - 1];
        num_elements = incr[num_dims];

        if (num_elements > 0)
        {
            c_index = 0;
            fortran_index = 0;
            if (coda_cursor_goto_array_element_by_index(&array_cursor, 0) != 0)
            {
                return -1;
            }
            for (;;)
            {
                do
                {
                    if ((*read_basic_type_function)(&array_cursor, &dst[fortran_index * basic_type_size]) != 0)
                    {
                        return -1;
                    }
                    c_index++;
                    if (c_index < num_elements)
                    {
                        if (coda_cursor_goto_next_array_element(&array_cursor) != 0)
                        {
                            return -1;
                        }
                    }
                    fortran_index += increment;
                } while (fortran_index < num_elements);

                if (c_index == num_elements)
                {
                    break;
                }

                fortran_index += incr[num_dims - 2] - incr[num_dims];
                i = num_dims - 3;
                while (i >= 0 && fortran_index >= incr[i + 2])
                {
                    fortran_index += incr[i] - incr[i + 2];
                    i--;
                }
            }
        }
    }

    return 0;
}